

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void pugi::impl::(anonymous_namespace)::node_copy_string<char*,unsigned_long>
               (char **dest,unsigned_long *header,uintptr_t header_mask,char_t *source,
               unsigned_long *source_header,xml_allocator *alloc)

{
  ulong uVar1;
  size_t source_length;
  
  if ((*dest != (char *)0x0) || (uVar1 = *header, (uVar1 & header_mask) != 0)) {
    __assert_fail("!dest && (header & header_mask) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                  ,0x111d,
                  "void pugi::impl::(anonymous namespace)::node_copy_string(String &, Header &, uintptr_t, char_t *, Header &, xml_allocator *) [String = char *, Header = unsigned long]"
                 );
  }
  if (source != (char_t *)0x0) {
    if ((alloc == (xml_allocator *)0x0) || ((*source_header & header_mask) != 0)) {
      source_length = strlen(source);
      strcpy_insitu<char*,unsigned_long>(dest,header,header_mask,source,source_length);
      return;
    }
    *dest = source;
    *header = uVar1 | 0x40;
    *(byte *)source_header = (byte)*source_header | 0x40;
  }
  return;
}

Assistant:

PUGI__FN void node_copy_string(String& dest, Header& header, uintptr_t header_mask, char_t* source, Header& source_header, xml_allocator* alloc)
	{
		assert(!dest && (header & header_mask) == 0);

		if (source)
		{
			if (alloc && (source_header & header_mask) == 0)
			{
				dest = source;

				// since strcpy_insitu can reuse document buffer memory we need to mark both source and dest as shared
				header |= xml_memory_page_contents_shared_mask;
				source_header |= xml_memory_page_contents_shared_mask;
			}
			else
				strcpy_insitu(dest, header, header_mask, source, strlength(source));
		}
	}